

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::GridRenderCase::renderTestPattern
          (GridRenderCase *this,IterationConfig *config)

{
  code *pcVar1;
  int iVar2;
  deUint32 dVar3;
  deBool dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  ShaderProgram *this_00;
  TestError *this_01;
  TestLog *pTVar6;
  MessageBuilder *pMVar7;
  undefined8 uVar8;
  MessageBuilder local_338;
  MessageBuilder local_1b8;
  float local_28;
  int local_24;
  GLfloat tessLevel;
  GLint tessLevelPos;
  Functions *gl;
  IterationConfig *config_local;
  GridRenderCase_conflict *this_local;
  
  gl = (Functions *)config;
  config_local = (IterationConfig *)this;
  pRVar5 = Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar5->_vptr_RenderContext[3])();
  _tessLevel = CONCAT44(extraout_var,iVar2);
  BBoxRenderCase::setupRender((BBoxRenderCase *)this,(IterationConfig *)gl);
  if (((ulong)this->m_program & 1) != 0) {
    pcVar1 = *(code **)(_tessLevel + 0xb48);
    this_00 = de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::
              operator->((UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> *)
                         &this->m_texture);
    dVar3 = glu::ShaderProgram::getProgram(this_00);
    local_24 = (*pcVar1)(dVar3,"u_tessellationLevel");
    local_28 = 2.8;
    do {
      dVar4 = ::deGetFalse();
      if ((dVar4 != 0) || (local_24 == -1)) {
        this_01 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_01,(char *)0x0,"tessLevelPos != -1",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                   ,0x50f);
        __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      dVar4 = ::deGetFalse();
    } while (dVar4 != 0);
    pTVar6 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_1b8,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<(&local_1b8,(char (*) [23])"u_tessellationLevel = ");
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_28);
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b8);
    (**(code **)(_tessLevel + 0x14e0))(0x40333333,local_24);
    (**(code **)(_tessLevel + 0xfd8))(0x8e72,3);
    dVar3 = (**(code **)(_tessLevel + 0x800))();
    glu::checkError(dVar3,"patch param",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                    ,0x515);
  }
  pTVar6 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_338,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar7 = tcu::MessageBuilder::operator<<(&local_338,(char (*) [16])"Rendering grid.");
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_338);
  uVar8 = 4;
  if (((ulong)this->m_program & 1) != 0) {
    uVar8 = 0xe;
  }
  (**(code **)(_tessLevel + 0x538))
            (uVar8,0,*(int *)((long)&this[1].super_TestCase.super_TestCase.super_TestNode.
                                     m_description.field_2 + 4) *
                     *(int *)((long)&this[1].super_TestCase.super_TestCase.super_TestNode.
                                     m_description.field_2 + 4) * 6);
  dVar3 = (**(code **)(_tessLevel + 0x800))();
  glu::checkError(dVar3,"draw",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                  ,0x51b);
  return;
}

Assistant:

void GridRenderCase::renderTestPattern (const IterationConfig& config)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	setupRender(config);

	if (m_hasTessellationStage)
	{
		const glw::GLint	tessLevelPos	= gl.getUniformLocation(m_program->getProgram(), "u_tessellationLevel");
		const glw::GLfloat	tessLevel		= 2.8f; // will be rounded up

		TCU_CHECK(tessLevelPos != -1);

		m_testCtx.getLog() << tcu::TestLog::Message << "u_tessellationLevel = " << tessLevel << tcu::TestLog::EndMessage;

		gl.uniform1f(tessLevelPos, tessLevel);
		gl.patchParameteri(GL_PATCH_VERTICES, 3);
		GLU_EXPECT_NO_ERROR(gl.getError(), "patch param");
	}

	m_testCtx.getLog() << tcu::TestLog::Message << "Rendering grid." << tcu::TestLog::EndMessage;

	gl.drawArrays((m_hasTessellationStage) ? (GL_PATCHES) : (GL_TRIANGLES), 0, m_gridSize * m_gridSize * 6);
	GLU_EXPECT_NO_ERROR(gl.getError(), "draw");
}